

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::Function::rebuildBlockPredecessors(Function *this)

{
  pointer ppVar1;
  Block *pBVar2;
  pointer ppVar3;
  value_type *pvVar4;
  int iVar5;
  pool_ref<soul::heart::Block> *b;
  pointer ppVar6;
  Terminator *pTVar7;
  undefined4 extraout_var;
  long *extraout_RDX;
  pool_ref<soul::heart::Block> *b_1;
  value_type *__x;
  pool_ptr<soul::heart::Terminator> t;
  pool_ptr<soul::heart::Terminator> local_30;
  long *plVar8;
  
  ppVar1 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (this->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1; ppVar6 = ppVar6 + 1) {
    pBVar2 = ppVar6->object;
    ppVar3 = (pBVar2->predecessors).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar2->predecessors).
        super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
      (pBVar2->predecessors).
      super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
    }
  }
  pvVar4 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar4; __x = __x + 1) {
    local_30.object = (__x->object->terminator).object;
    if (local_30.object != (Terminator *)0x0) {
      pTVar7 = pool_ptr<soul::heart::Terminator>::operator->(&local_30);
      iVar5 = (*(pTVar7->super_Object)._vptr_Object[2])(pTVar7);
      for (plVar8 = (long *)CONCAT44(extraout_var,iVar5); plVar8 != extraout_RDX;
          plVar8 = plVar8 + 1) {
        std::
        vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
        ::push_back((vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                     *)(*plVar8 + 0x48),__x);
      }
    }
  }
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn)
        {
            for (auto p : parameters)
                p->visitExpressions (fn, AccessType::read);

            for (auto s : statements)
                s->visitExpressions (fn);

            if (terminator != nullptr)
                terminator->visitExpressions (fn);
        }